

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParallelDescriptor.cpp
# Opt level: O0

void amrex::ParallelDescriptor::StartTeams(void)

{
  int iVar1;
  int iVar2;
  int rank;
  int nprocs;
  int do_team_reduce;
  int team_size;
  bool local_19;
  int iVar3;
  int iVar4;
  
  iVar4 = 1;
  iVar3 = 0;
  iVar1 = NProcs();
  iVar2 = MyProc();
  if (iVar1 % iVar4 != 0) {
    Abort_host((char *)CONCAT44(iVar4,iVar3));
  }
  m_Team._0_4_ = iVar1 / iVar4;
  m_Team._4_4_ = iVar4;
  m_Team._8_4_ = iVar2 / iVar4;
  m_Team._12_4_ = (iVar2 / iVar4) * iVar4;
  m_Team._16_4_ = iVar2 - m_Team._12_4_;
  local_19 = 0 < iVar4 && iVar3 != 0;
  m_Team._20_4_ = (uint)local_19;
  return;
}

Assistant:

void
StartTeams ()
{
    int team_size = 1;
    int do_team_reduce = 0;

#if defined(BL_USE_MPI3)
    ParmParse pp("team");
    pp.queryAdd("size", team_size);
    pp.queryAdd("reduce", do_team_reduce);
#endif

    int nprocs = ParallelDescriptor::NProcs();
    int rank   = ParallelDescriptor::MyProc();

    if (nprocs % team_size != 0)
        amrex::Abort("Number of processes not divisible by team size");

    m_Team.m_numTeams    = nprocs / team_size;
    m_Team.m_size        = team_size;
    m_Team.m_color       = rank / team_size;
    m_Team.m_lead        = m_Team.m_color * team_size;
    m_Team.m_rankInTeam  = rank - m_Team.m_lead;

    m_Team.m_do_team_reduce = team_size > 0 && do_team_reduce;

#if defined(BL_USE_MPI3)
    {
        MPI_Group grp, team_grp, lead_grp;
        BL_MPI_REQUIRE( MPI_Comm_group(ParallelDescriptor::Communicator(), &grp) );
        int team_ranks[team_size];
        for (int i = 0; i < team_size; ++i) {
            team_ranks[i] = MyTeamLead() + i;
        }
        BL_MPI_REQUIRE( MPI_Group_incl(grp, team_size, team_ranks, &team_grp) );
        BL_MPI_REQUIRE( MPI_Comm_create(ParallelDescriptor::Communicator(),
                                        team_grp, &m_Team.m_team_comm) );

        std::vector<int>lead_ranks(m_Team.m_numTeams);
        for (int i = 0; i < lead_ranks.size(); ++i) {
            lead_ranks[i] = i * team_size;
        }
        BL_MPI_REQUIRE( MPI_Group_incl(grp, lead_ranks.size(), &lead_ranks[0], &lead_grp) );
        BL_MPI_REQUIRE( MPI_Comm_create(ParallelDescriptor::Communicator(),
                                        lead_grp, &m_Team.m_lead_comm) );

        BL_MPI_REQUIRE( MPI_Group_free(&grp) );
        BL_MPI_REQUIRE( MPI_Group_free(&team_grp) );
        BL_MPI_REQUIRE( MPI_Group_free(&lead_grp) );
    }
#endif
}